

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreImporter::ReadMaterials
          (OgreImporter *this,string *pFile,IOSystem *pIOHandler,aiScene *pScene,Mesh *mesh)

{
  size_t sVar1;
  SubMesh *pSVar2;
  size_t index;
  OgreImporter *this_00;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> materials;
  aiMaterial *material;
  undefined1 local_68 [8];
  pointer ppaStack_60;
  pointer local_58;
  aiScene *local_48;
  _Base_ptr local_40;
  aiMaterial *local_38;
  
  local_68 = (undefined1  [8])0x0;
  ppaStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  this_00 = (OgreImporter *)mesh;
  local_48 = pScene;
  local_40 = (_Base_ptr)pIOHandler;
  sVar1 = Ogre::Mesh::NumSubMeshes(mesh);
  for (index = 0; sVar1 != index; index = index + 1) {
    this_00 = (OgreImporter *)mesh;
    pSVar2 = Ogre::Mesh::GetSubMesh(mesh,index);
    if ((pSVar2 != (SubMesh *)0x0) && ((pSVar2->super_ISubMesh).materialRef._M_string_length != 0))
    {
      this_00 = this;
      local_38 = ReadMaterial(this,pFile,(IOSystem *)local_40,&(pSVar2->super_ISubMesh).materialRef)
      ;
      if (local_38 != (aiMaterial *)0x0) {
        (pSVar2->super_ISubMesh).materialIndex =
             (int)((ulong)((long)ppaStack_60 - (long)local_68) >> 3);
        this_00 = (OgreImporter *)local_68;
        std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                  ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)local_68,&local_38);
      }
    }
  }
  AssignMaterials(this_00,local_48,(vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)local_68);
  std::_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~_Vector_base
            ((_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)local_68);
  return;
}

Assistant:

void OgreImporter::ReadMaterials(const std::string &pFile, Assimp::IOSystem *pIOHandler, aiScene *pScene, Mesh *mesh)
{
    std::vector<aiMaterial*> materials;

    // Create materials that can be found and parsed via the IOSystem.
    for (size_t i=0, len=mesh->NumSubMeshes(); i<len; ++i)
    {
        SubMesh *submesh = mesh->GetSubMesh(i);
        if (submesh && !submesh->materialRef.empty())
        {
            aiMaterial *material = ReadMaterial(pFile, pIOHandler, submesh->materialRef);
            if (material)
            {
                submesh->materialIndex = static_cast<int>(materials.size());
                materials.push_back(material);
            }
        }
    }

    AssignMaterials(pScene, materials);
}